

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamReaderPrivate::putStringLiteral(QXmlStreamReaderPrivate *this,QStringView s)

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  const_reverse_iterator end;
  long lVar4;
  long lVar5;
  
  lVar5 = s.m_size;
  lVar1 = (this->putStack).tos + lVar5;
  lVar3 = (this->putStack).cap;
  if (lVar3 <= lVar1) {
    lVar1 = lVar1 + 1;
    lVar4 = lVar3 * 2;
    if (lVar1 != lVar4 && SBORROW8(lVar1,lVar4) == lVar1 + lVar3 * -2 < 0) {
      lVar4 = lVar1;
    }
    (this->putStack).cap = lVar4;
    puVar2 = (uint *)realloc((this->putStack).data,lVar4 << 2);
    (this->putStack).data = puVar2;
    if (puVar2 == (uint *)0x0) {
      qBadAlloc();
    }
  }
  if (lVar5 != 0) {
    puVar2 = (this->putStack).data;
    lVar3 = (this->putStack).tos;
    lVar5 = lVar5 * 2;
    do {
      puVar2[lVar3 + 1] = *(ushort *)((long)s.m_data + lVar5 + -2) | 0x1a0000;
      lVar3 = lVar3 + 1;
      lVar5 = lVar5 + -2;
    } while (lVar5 != 0);
    (this->putStack).tos = lVar3;
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::putStringLiteral(QStringView s)
{
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it)
        putStack.rawPush() = ((LETTER << 16) | it->unicode());
}